

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  char *__s;
  DescriptorPool *this;
  size_t sVar1;
  FileDescriptor *this_00;
  Descriptor *desc;
  int i;
  int index;
  string_view name;
  Message **defaults;
  Message **local_30;
  anon_class_8_1_0e5317d0 local_28;
  
  AssignDescriptors(table);
  this = DescriptorPool::internal_generated_pool();
  __s = table->filename;
  sVar1 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar1;
  this_00 = DescriptorPool::FindFileByName(this,name);
  local_30 = table->default_instances;
  local_28.defaults = &local_30;
  for (index = 0; index < this_00->message_type_count_; index = index + 1) {
    desc = FileDescriptor::message_type(this_00,index);
    cpp::
    VisitDescriptorsInFileOrder<google::protobuf::internal::RegisterFileLevelMetadata(google::protobuf::internal::DescriptorTable_const*)::__0>
              (desc,&local_28);
  }
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  auto* file = DescriptorPool::internal_generated_pool()->FindFileByName(
      table->filename);
  auto defaults = table->default_instances;
  internal::cpp::VisitDescriptorsInFileOrder(file, [&](auto* desc) {
    MessageFactory::InternalRegisterGeneratedMessage(desc, *defaults);
    ++defaults;
    return std::false_type{};
  });
}